

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError str2num(long *val,char *str)

{
  char *pcVar1;
  int *piVar2;
  long lVar3;
  size_t sVar4;
  ParameterError PVar5;
  char *endptr;
  
  if (str == (char *)0x0) {
    PVar5 = PARAM_BAD_NUMERIC;
  }
  else {
    endptr = (char *)0x0;
    piVar2 = __errno_location();
    *piVar2 = 0;
    PVar5 = PARAM_BAD_NUMERIC;
    lVar3 = strtol(str,&endptr,10);
    pcVar1 = endptr;
    if (*piVar2 == 0x22) {
      PVar5 = PARAM_NUMBER_TOO_LARGE;
    }
    else if ((endptr != str) && (sVar4 = strlen(str), pcVar1 == str + sVar4)) {
      *val = lVar3;
      PVar5 = PARAM_OK;
    }
  }
  return PVar5;
}

Assistant:

ParameterError str2num(long *val, const char *str)
{
  if(str) {
    char *endptr = NULL;
    long num;
    errno = 0;
    num = strtol(str, &endptr, 10);
    if(errno == ERANGE)
      return PARAM_NUMBER_TOO_LARGE;
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}